

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.h
# Opt level: O0

bool __thiscall
basisu::etc_block::get_block_colors
          (etc_block *this,color_rgba *pBlock_colors,uint32_t subblock_index)

{
  bool bVar1;
  byte bVar2;
  uint32_t uVar3;
  uint sg;
  uint sr;
  color_rgba *this_00;
  int in_EDX;
  long in_RSI;
  etc_block *in_RDI;
  bool dc;
  int *pInten_table;
  color_rgba b;
  uint32_t in_stack_ffffffffffffff7c;
  etc_block *in_stack_ffffffffffffff80;
  long lVar4;
  uint32_t in_stack_ffffffffffffff8c;
  etc_block *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffa0;
  uint32_t alpha;
  undefined4 in_stack_ffffffffffffffa8;
  undefined1 scaled;
  undefined4 in_stack_ffffffffffffffac;
  color_rgba *in_stack_ffffffffffffffb0;
  bool local_29;
  int *local_28;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_1c;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_18;
  int local_14;
  long local_10;
  
  scaled = (undefined1)((uint)in_stack_ffffffffffffffa8 >> 0x18);
  alpha = (uint32_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  local_14 = in_EDX;
  local_10 = in_RSI;
  color_rgba::color_rgba((color_rgba *)&local_18.field_1);
  bVar1 = get_diff_bit(in_RDI);
  if (bVar1) {
    if (local_14 == 0) {
      get_base5_color(in_stack_ffffffffffffff90);
      unpack_color5((color_rgba *)in_stack_ffffffffffffff80,
                    (uint16_t)(in_stack_ffffffffffffff7c >> 0x10),
                    SUB41(in_stack_ffffffffffffff7c >> 8,0));
    }
    else {
      get_base5_color(in_stack_ffffffffffffff90);
      get_delta3_color(in_stack_ffffffffffffff90);
      unpack_color5(in_stack_ffffffffffffffb0,(uint16_t)((uint)in_stack_ffffffffffffffac >> 0x10),
                    (uint16_t)in_stack_ffffffffffffffac,(bool)scaled,alpha);
    }
  }
  else {
    get_base4_color(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    local_1c.field_1 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
         unpack_color4((uint16_t)((ulong)in_stack_ffffffffffffff90 >> 0x10),
                       SUB81((ulong)in_stack_ffffffffffffff90 >> 8,0),in_stack_ffffffffffffff8c);
    local_18.field_1 = local_1c.field_1;
  }
  uVar3 = get_inten_table(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  local_28 = (int *)(g_etc1_inten_tables + (ulong)uVar3 * 0x10);
  local_29 = false;
  lVar4 = local_10;
  bVar2 = clamp255(((uint)local_18 & 0xff) + *local_28,&local_29);
  sg = (uint)bVar2;
  bVar2 = clamp255(((uint)local_18 >> 8 & 0xff) + *local_28,&local_29);
  sr = (uint)bVar2;
  clamp255(((uint)local_18 >> 0x10 & 0xff) + *local_28,&local_29);
  color_rgba::set((color_rgba *)in_stack_ffffffffffffff90,sr,sg,(int)((ulong)lVar4 >> 0x20),
                  (int)lVar4);
  this_00 = (color_rgba *)(local_10 + 4);
  clamp255(((uint)local_18 & 0xff) + local_28[1],&local_29);
  clamp255(((uint)local_18 >> 8 & 0xff) + local_28[1],&local_29);
  clamp255(((uint)local_18 >> 0x10 & 0xff) + local_28[1],&local_29);
  color_rgba::set(this_00,sr,sg,(int)((ulong)lVar4 >> 0x20),(int)lVar4);
  clamp255(((uint)local_18 & 0xff) + local_28[2],&local_29);
  clamp255(((uint)local_18 >> 8 & 0xff) + local_28[2],&local_29);
  clamp255(((uint)local_18 >> 0x10 & 0xff) + local_28[2],&local_29);
  color_rgba::set(this_00,sr,sg,(int)((ulong)lVar4 >> 0x20),(int)lVar4);
  clamp255(((uint)local_18 & 0xff) + local_28[3],&local_29);
  clamp255(((uint)local_18 >> 8 & 0xff) + local_28[3],&local_29);
  clamp255(((uint)local_18 >> 0x10 & 0xff) + local_28[3],&local_29);
  color_rgba::set(this_00,sr,sg,(int)((ulong)lVar4 >> 0x20),(int)lVar4);
  return (bool)(local_29 & 1);
}

Assistant:

bool get_block_colors(color_rgba* pBlock_colors, uint32_t subblock_index) const
		{
			color_rgba b;

			if (get_diff_bit())
			{
				if (subblock_index)
					unpack_color5(b, get_base5_color(), get_delta3_color(), true);
				else
					unpack_color5(b, get_base5_color(), true);
			}
			else
			{
				b = unpack_color4(get_base4_color(subblock_index), true);
			}

			const int* pInten_table = g_etc1_inten_tables[get_inten_table(subblock_index)];

			bool dc = false;

			pBlock_colors[0].set(clamp255(b.r + pInten_table[0], dc), clamp255(b.g + pInten_table[0], dc), clamp255(b.b + pInten_table[0], dc), 255);
			pBlock_colors[1].set(clamp255(b.r + pInten_table[1], dc), clamp255(b.g + pInten_table[1], dc), clamp255(b.b + pInten_table[1], dc), 255);
			pBlock_colors[2].set(clamp255(b.r + pInten_table[2], dc), clamp255(b.g + pInten_table[2], dc), clamp255(b.b + pInten_table[2], dc), 255);
			pBlock_colors[3].set(clamp255(b.r + pInten_table[3], dc), clamp255(b.g + pInten_table[3], dc), clamp255(b.b + pInten_table[3], dc), 255);

			return dc;
		}